

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeColumns(ImGuiOldColumns *columns)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  ImGuiOldColumnData *pIVar4;
  ImGuiOldColumns *in_RDI;
  float fVar5;
  ImGuiOldColumnData *column;
  ImGuiOldColumnData *__end1;
  ImGuiOldColumnData *__begin1;
  ImVector<ImGuiOldColumnData> *__range1;
  ImGuiOldColumnData *local_18;
  
  bVar2 = TreeNode((void *)(ulong)in_RDI->ID,"Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                   (ulong)in_RDI->ID,(ulong)(uint)in_RDI->Count,(ulong)(uint)in_RDI->Flags);
  if (bVar2) {
    BulletText((char *)(double)(in_RDI->OffMaxX - in_RDI->OffMinX),(double)in_RDI->OffMinX,
               (double)in_RDI->OffMaxX,"Width: %.1f (MinX: %.1f, MaxX: %.1f)");
    local_18 = ImVector<ImGuiOldColumnData>::begin(&in_RDI->Columns);
    pIVar4 = ImVector<ImGuiOldColumnData>::end(&in_RDI->Columns);
    for (; local_18 != pIVar4; local_18 = local_18 + 1) {
      uVar3 = ImVector<ImGuiOldColumnData>::index_from_ptr(&in_RDI->Columns,local_18);
      fVar1 = local_18->OffsetNorm;
      fVar5 = GetColumnOffsetFromNorm(in_RDI,local_18->OffsetNorm);
      BulletText((char *)(double)fVar1,(double)fVar5,"Column %02d: OffsetNorm %.3f (= %.1f px)",
                 (ulong)uVar3);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeColumns(ImGuiOldColumns* columns)
{
    if (!TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
        return;
    BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
    for (ImGuiOldColumnData& column : columns->Columns)
        BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", (int)columns->Columns.index_from_ptr(&column), column.OffsetNorm, GetColumnOffsetFromNorm(columns, column.OffsetNorm));
    TreePop();
}